

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  IString str;
  undefined *__s;
  bool bVar1;
  size_type sVar2;
  char *input_00;
  Element *module_00;
  reference pNVar3;
  Function *this_00;
  pointer *this_01;
  reference this_02;
  reference __in;
  type *ptVar4;
  type *ptVar5;
  Module *pMVar6;
  Global *pGVar7;
  pointer pGVar8;
  char *in_RCX;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *in_R8;
  IString specific;
  Name newName;
  Name local_7b0;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_7a0;
  __single_object global_1;
  type *type;
  type *name_2;
  _Self local_770;
  iterator __end2_1;
  iterator __begin2_1;
  InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_> *__range2_1;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  char *local_730;
  size_t local_728;
  char *pcStack_720;
  size_t local_718;
  char *pcStack_710;
  Function *local_700;
  Function *func;
  Name *name_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range3_1;
  Name *name;
  iterator __end3;
  iterator __begin3;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  SExpressionWasmBuilder builder;
  Element *root;
  SExpressionParser parser;
  allocator<char> local_399;
  string local_398 [8];
  string input;
  Module intrinsicsModule;
  IString local_28;
  Module *local_18;
  Module *module_local;
  RemoveNonJSOpsPass *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  memset(&local_28,0,0x10);
  IString::IString(&local_28);
  specific.str._M_str = in_RCX;
  specific.str._M_len = (size_t)local_28.str._M_str;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)local_28.str._M_len,specific);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->builder);
  if (!bVar1) {
    std::make_unique<wasm::Builder,wasm::Module&>
              ((Module *)&intrinsicsModule.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
              (&this->builder,
               (unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &intrinsicsModule.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &intrinsicsModule.tagsMap._M_h._M_single_bucket);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,local_18);
  sVar2 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::size(&this->neededIntrinsics);
  if (sVar2 != 0) {
    Module::Module((Module *)((long)&input.field_2 + 8));
    __s = IntrinsicsModuleWast;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_398,__s,&local_399);
    std::allocator<char>::~allocator(&local_399);
    input_00 = (char *)std::__cxx11::string::c_str();
    SExpressionParser::SExpressionParser((SExpressionParser *)&root,input_00);
    module_00 = Element::operator[]((Element *)parser.allocator.next._M_b._M_p,0);
    SExpressionWasmBuilder::SExpressionWasmBuilder
              ((SExpressionWasmBuilder *)
               &neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Module *)((long)&input.field_2 + 8),module_00,Normal);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    while (sVar2 = std::
                   unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::size(&this->neededIntrinsics), sVar2 != 0) {
      __end3 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(&this->neededIntrinsics);
      name = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&this->neededIntrinsics);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wasm::Name,_true>,
                                (_Node_iterator_base<wasm::Name,_true> *)&name), bVar1) {
        pNVar3 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3);
        in_R8 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3;
        addNeededFunctions(this,(Module *)((long)&input.field_2 + 8),
                           (Name)(pNVar3->super_IString).str,in_R8);
        std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3);
      }
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::clear(&this->neededIntrinsics);
      __end3_1 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                           ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            &__range3);
      name_1 = (Name *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                                 ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&__range3);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&name_1), bVar1) {
        func = (Function *)std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end3_1);
        local_718 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
        pcStack_710 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
        local_700 = Module::getFunctionOrNull
                              (local_18,(Name)(func->super_Importable).super_Named.name.
                                              super_IString.str);
        if (local_700 == (Function *)0x0) {
          local_728 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
          pcStack_720 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
          this_00 = Module::getFunction((Module *)((long)&input.field_2 + 8),
                                        (Name)(func->super_Importable).super_Named.name.
                                              super_IString.str);
          pMVar6 = local_18;
          wasm::Name::Name((Name *)&__range2);
          newName.super_IString.str._M_str = (char *)in_R8;
          newName.super_IString.str._M_len = (size_t)local_730;
          local_700 = wasm::ModuleUtils::copyFunction
                                ((ModuleUtils *)this_00,(Function *)pMVar6,(Module *)__range2,
                                 newName);
        }
        doWalkFunction(this,local_700);
        std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end3_1);
      }
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::clear
                ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    }
    this_01 = &intrinsicsModule.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      *)this_01);
    global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
             std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::end((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2);
      pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_02);
      wasm::ModuleUtils::copyGlobal(pGVar8,local_18);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2);
    }
    MemoryUtils::ensureExists(local_18);
    __end2_1 = InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::begin
                         (&this->neededImportedGlobals);
    local_770._M_node =
         (_List_node_base *)
         InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::end(&this->neededImportedGlobals);
    while (bVar1 = std::operator!=(&__end2_1,&local_770), bVar1) {
      __in = std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>::operator*(&__end2_1);
      ptVar4 = std::get<0ul,wasm::Name,wasm::Type>(__in);
      ptVar5 = std::get<1ul,wasm::Name,wasm::Type>(__in);
      pMVar6 = Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                          ).
                          super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .
                          super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                        );
      global_1._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
           (ptVar4->super_IString).str._M_len;
      pGVar7 = Module::getGlobalOrNull(pMVar6,(Name)(ptVar4->super_IString).str);
      if (pGVar7 == (Global *)0x0) {
        std::make_unique<wasm::Global>();
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_7a0);
        wasm::Name::operator=((Name *)pGVar8,ptVar4);
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_7a0);
        (pGVar8->type).id = ptVar5->id;
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_7a0);
        pGVar8->mutable_ = false;
        str.str._M_str = (char *)ENV._8_8_;
        str.str._M_len = ENV._0_8_;
        wasm::Name::Name(&local_7b0,str);
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_7a0);
        wasm::Name::operator=(&(pGVar8->super_Importable).module,&local_7b0);
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_7a0);
        wasm::Name::operator=(&(pGVar8->super_Importable).base,ptVar4);
        pMVar6 = local_18;
        pGVar8 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::release
                           (&local_7a0);
        Module::addGlobal(pMVar6,pGVar8);
        std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_7a0);
      }
      std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>::operator++(&__end2_1);
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    SExpressionWasmBuilder::~SExpressionWasmBuilder
              ((SExpressionWasmBuilder *)
               &neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    SExpressionParser::~SExpressionParser((SExpressionParser *)&root);
    std::__cxx11::string::~string(local_398);
    Module::~Module((Module *)((long)&input.field_2 + 8));
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    std::string input(IntrinsicsModuleWast);
    SExpressionParser parser(const_cast<char*>(input.c_str()));
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(
      intrinsicsModule, *root[0], IRProfile::Normal);

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }